

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall line_hash_8::test_method(line_hash_8 *this)

{
  unit_test_log_t *puVar1;
  const_string local_e8;
  const_string local_d8;
  const_string local_c8;
  const_string local_b8;
  const_string local_a8;
  const_string local_98;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  unit_test_log_t local_58;
  undefined1 local_50;
  undefined1 *local_48;
  char *local_40;
  undefined4 local_38;
  uchar local_31;
  
  local_e8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_e8.m_end = "";
  local_d8.m_begin = "";
  local_d8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_e8,0x3f,&local_d8);
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_80 = "";
  local_31 = assert_hash::line_hash<unsigned_char>(0);
  local_38 = 0;
  puVar1 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (puVar1,&local_88,0x3f,1,2,&local_31,"ah::line_hash< std::uint8_t >( 0 )",&local_38,"0")
  ;
  local_c8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_c8.m_end = "";
  local_b8.m_begin = "";
  local_b8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_c8,0x40,&local_b8);
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_70 = "";
  local_31 = assert_hash::line_hash<unsigned_char>(0x12);
  local_38 = 0x12;
  puVar1 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (puVar1,&local_78,0x40,1,2,&local_31,"ah::line_hash< std::uint8_t >( 0x12 )",&local_38,
             "0x12");
  local_a8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_a8.m_end = "";
  local_98.m_begin = "";
  local_98.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_a8,0x41,&local_98);
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_60 = "";
  local_31 = assert_hash::line_hash<unsigned_char>(0x12345678);
  local_38 = 0x14;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_58,&local_68,0x41,1,2,&local_31,"ah::line_hash< std::uint8_t >( 0x12345678 )",
             &local_38,"( 0x78 + 0x56 + 0x34 + 0x12 ) & 0xff");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( line_hash_8 )
{
    BOOST_CHECK_EQUAL( ah::line_hash< std::uint8_t >( 0 ), 0 );
    BOOST_CHECK_EQUAL( ah::line_hash< std::uint8_t >( 0x12 ), 0x12 );
    BOOST_CHECK_EQUAL( ah::line_hash< std::uint8_t >( 0x12345678 ), ( 0x78 + 0x56 + 0x34 + 0x12 ) & 0xff );
}